

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkSamplerYcbcrConversionCreateInfo *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericStringRef<char> local_d0;
  GenericStringRef<char> local_c0;
  GenericStringRef<char> local_b0;
  GenericStringRef<char> local_a0;
  GenericStringRef<char> local_90;
  GenericStringRef<char> local_80;
  GenericStringRef<char> local_70;
  GenericStringRef<char> local_60;
  GenericStringRef<char> local_50;
  undefined1 local_40 [8];
  Value comp;
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkSamplerYcbcrConversionCreateInfo *create_info_local;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)&comp.data_ + 8),kObjectType);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_40,kArrayType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_50,(char (*) [6])"sType");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)&comp.data_ + 8),&local_50,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_60,(char (*) [7])0x4b9f29);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkFormat>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)((long)&comp.data_ + 8),&local_60,create_info->format,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_70,(char (*) [11])"ycbcrModel");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerYcbcrModelConversion>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)&comp.data_ + 8),&local_70,create_info->ycbcrModel,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_80,(char (*) [11])"ycbcrRange");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkSamplerYcbcrRange>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)&comp.data_ + 8),&local_80,create_info->ycbcrRange,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack<VkComponentSwizzle>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,(create_info->components).r,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack<VkComponentSwizzle>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,(create_info->components).g,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack<VkComponentSwizzle>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,(create_info->components).b,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack<VkComponentSwizzle>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_40,(create_info->components).a,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_90,(char (*) [11])0x498715);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((long)&comp.data_ + 8),&local_90,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_40,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<14u>(&local_a0,(char (*) [14])"xChromaOffset")
  ;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkChromaLocation>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)&comp.data_ + 8),&local_a0,create_info->xChromaOffset,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<14u>(&local_b0,(char (*) [14])"yChromaOffset")
  ;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkChromaLocation>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)&comp.data_ + 8),&local_b0,create_info->yChromaOffset,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_c0,(char (*) [13])"chromaFilter");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkFilter>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)((long)&comp.data_ + 8),&local_c0,create_info->chromaFilter,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<28u>
            (&local_d0,(char (*) [28])"forceExplicitReconstruction");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)&comp.data_ + 8),&local_d0,create_info->forceExplicitReconstruction,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(out_value,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((long)&comp.data_ + 8));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_40);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)((long)&comp.data_ + 8));
  return true;
}

Assistant:

static bool json_value(const VkSamplerYcbcrConversionCreateInfo &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	Value comp(kArrayType);

	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("format", create_info.format, alloc);
	value.AddMember("ycbcrModel", create_info.ycbcrModel, alloc);
	value.AddMember("ycbcrRange", create_info.ycbcrRange, alloc);
	comp.PushBack(create_info.components.r, alloc);
	comp.PushBack(create_info.components.g, alloc);
	comp.PushBack(create_info.components.b, alloc);
	comp.PushBack(create_info.components.a, alloc);
	value.AddMember("components", comp, alloc);
	value.AddMember("xChromaOffset", create_info.xChromaOffset, alloc);
	value.AddMember("yChromaOffset", create_info.yChromaOffset, alloc);
	value.AddMember("chromaFilter", create_info.chromaFilter, alloc);
	value.AddMember("forceExplicitReconstruction", create_info.forceExplicitReconstruction, alloc);

	*out_value = value;
	return true;
}